

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Entry * __thiscall
kj::
Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
::insert(Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
         *this,Entry *row)

{
  RemoveConst<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry> *pRVar1;
  Entry *pEVar2;
  RawBrandedSchema *pRVar3;
  RemoveConst<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry> *pRVar4;
  size_t newSize;
  Impl<0UL,_false> local_28 [16];
  
  Impl<0UL,_false>::insert
            (local_28,this,(long)(this->rows).builder.pos - (long)(this->rows).builder.ptr >> 4,row,
             0xffffffff);
  if (local_28[0] != (Impl<0UL,_false>)0x1) {
    pRVar4 = (this->rows).builder.pos;
    if (pRVar4 == (this->rows).builder.endPtr) {
      pRVar1 = (this->rows).builder.ptr;
      newSize = 4;
      if (pRVar4 != pRVar1) {
        newSize = (long)pRVar4 - (long)pRVar1 >> 3;
      }
      Vector<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry>::setCapacity
                (&this->rows,newSize);
      pRVar4 = (this->rows).builder.pos;
    }
    pRVar3 = (row->value).super_Schema.raw;
    pRVar4->key = row->key;
    (pRVar4->value).super_Schema.raw = pRVar3;
    pEVar2 = (this->rows).builder.pos;
    (this->rows).builder.pos = pEVar2 + 1;
    return pEVar2;
  }
  kj::_::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  if (kj::none != Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }
}